

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# breadcrumb.c
# Opt level: O2

CgreenBreadcrumb * create_breadcrumb(void)

{
  CgreenBreadcrumb *pCVar1;
  
  pCVar1 = (CgreenBreadcrumb *)calloc(1,0x10);
  return pCVar1;
}

Assistant:

CgreenBreadcrumb *create_breadcrumb(void) {
    CgreenBreadcrumb *breadcrumb = (CgreenBreadcrumb *) malloc(sizeof(CgreenBreadcrumb));
    if (breadcrumb == NULL) {
        return NULL;
    }
    breadcrumb->trail = NULL;
    breadcrumb->depth = 0;
    breadcrumb->space = 0;
    return breadcrumb;
}